

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O1

void __thiscall
r_exec::AutoFocusController::dispatch
          (AutoFocusController *this,View *input,_Fact *abstract_input,BindingMap *bm,bool *injected
          ,TPXMap *map)

{
  char cVar1;
  View *input_00;
  _Hash_node_base *p_Var2;
  Input local_58;
  
  p_Var2 = (map->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      cVar1 = (*(code *)(p_Var2[2]._M_nxt)->_M_nxt[2]._M_nxt)
                        (p_Var2[2]._M_nxt,input,abstract_input,bm);
      if ((cVar1 != '\0') && (*injected == false)) {
        *injected = true;
        input_00 = inject_input(this,input);
        Input::Input(&local_58,input_00,abstract_input,bm);
        r_code::list<r_exec::Input>::push_back
                  (&(this->cross_buffer).super_list<r_exec::Input>,&local_58);
        if (local_58.input.object != (_Object *)0x0) {
          LOCK();
          ((local_58.input.object)->refCount).super___atomic_base<long>._M_i =
               ((local_58.input.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_58.input.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(local_58.input.object)->_vptr__Object[1])();
          }
        }
        if (local_58.abstraction.object != (_Object *)0x0) {
          LOCK();
          ((local_58.abstraction.object)->refCount).super___atomic_base<long>._M_i =
               ((local_58.abstraction.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_58.abstraction.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(local_58.abstraction.object)->_vptr__Object[1])();
          }
        }
        if (local_58.bindings.object != (_Object *)0x0) {
          LOCK();
          ((local_58.bindings.object)->refCount).super___atomic_base<long>._M_i =
               ((local_58.bindings.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_58.bindings.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(local_58.bindings.object)->_vptr__Object[1])();
          }
        }
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

inline void AutoFocusController::dispatch(View *input, _Fact *abstract_input, BindingMap *bm, bool &injected, TPXMap &map)
{
    TPXMap::const_iterator m;

    for (m = map.begin(); m != map.end(); ++m) {
        if (m->second->take_input(input, abstract_input, bm)) {
            if (!injected) {
                injected = true;
                inject_input(input, abstract_input, bm);
            }
        }
    }
}